

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O3

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,EndElementType *param_1)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  
  if (this->m_state == STATE_ELEMENT_END) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_rawDst,"\n",1);
    if (0 < (int)((ulong)((long)(this->m_elementStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_elementStack).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(this->m_rawDst,"  ",2);
        iVar5 = iVar5 + 1;
      } while (iVar5 < (int)((ulong)((long)(this->m_elementStack).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_elementStack).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1);
    }
  }
  else if (this->m_state == STATE_ELEMENT) {
    poVar3 = this->m_rawDst;
    pcVar6 = "/>";
    lVar4 = 2;
    goto LAB_001327d5;
  }
  poVar3 = this->m_rawDst;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</",2);
  pbVar1 = (this->m_elementStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,pbVar1[-1]._M_dataplus._M_p,pbVar1[-1]._M_string_length);
  pcVar6 = ">";
  lVar4 = 1;
LAB_001327d5:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar4);
  pbVar1 = (this->m_elementStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_elementStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
  }
  this->m_state = STATE_ELEMENT_END;
  return this;
}

Assistant:

Writer& Writer::operator<< (const EndElementType&)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << "/>";
	else
	{
		if (m_state == STATE_ELEMENT_END)
		{
			m_rawDst << "\n";
			for (int i = 0; i < (int)m_elementStack.size()-1; i++)
				m_rawDst << "  ";
		}

		m_rawDst << "</" << m_elementStack.back() << ">";
	}

	m_elementStack.pop_back();
	m_state = STATE_ELEMENT_END;

	return *this;
}